

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall bgui::ImageWindow::onMouseMove(ImageWindow *this,int x,int y,int state)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ECX;
  long lVar3;
  int in_EDX;
  int in_ESI;
  ImageWindow *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ImageWindow *in_stack_00000220;
  undefined8 in_stack_ffffffffffffffa8;
  string local_38 [22];
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_ECX == 1) {
    in_RDI->imx = in_RDI->xp - in_ESI;
    in_RDI->imy = in_RDI->yp - in_EDX;
    redrawImage(in_RDI,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    updateInfo(in_stack_00000220);
  }
  if ((((in_ECX == 0x21) || (in_ECX == 4)) && (in_RDI->adapt != (ImageAdapterBase *)0x0)) &&
     (-1 < in_ESI + in_RDI->imx)) {
    lVar3 = (long)(in_ESI + in_RDI->imx);
    iVar1 = (*in_RDI->adapt->_vptr_ImageAdapterBase[0xb])();
    if ((lVar3 < CONCAT44(extraout_var,iVar1)) && (-1 < in_EDX + in_RDI->imy)) {
      iVar1 = in_RDI->imy;
      iVar2 = (*in_RDI->adapt->_vptr_ImageAdapterBase[0xc])();
      if ((long)(in_EDX + iVar1) < CONCAT44(extraout_var_00,iVar2)) {
        in_RDI->showinfo = false;
        (*in_RDI->adapt->_vptr_ImageAdapterBase[10])
                  (local_38,in_RDI->adapt,(long)(in_ESI + in_RDI->imx),(long)(in_EDX + in_RDI->imy),
                   in_R8,in_R9,local_38);
        std::__cxx11::string::c_str();
        BaseWindow::getTextHeight(&in_RDI->super_BaseWindow);
        BaseWindow::setInfoLine
                  ((BaseWindow *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                   (bool)in_stack_ffffffffffffffde);
        std::__cxx11::string::~string(local_38);
      }
    }
  }
  return;
}

Assistant:

void ImageWindow::onMouseMove(int x, int y, int state)
{
  // if left button is pressed, then perform panning

  if (state == button1mask)
  {
    imx=xp-x;
    imy=yp-y;

    redrawImage();
    updateInfo();
  }

  if ((state == (button1mask|shiftmask) || state == button3mask) &&
      adapt != 0 && x+imx >= 0 && x+imx < adapt->getWidth() && y+imy >= 0 &&
      y+imy < adapt->getHeight())
  {
    showinfo=false;
    setInfoLine(adapt->getDescriptionOfPixel(x+imx, y+imy).c_str(),
                y > getTextHeight());
  }
}